

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_cut.c
# Opt level: O1

ssize_t mpt_buffer_cut(mpt_buffer *buf,size_t off,size_t len)

{
  mpt_type_traits *pmVar1;
  _func_void_void_ptr *p_Var2;
  ulong uVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  void *__dest;
  
  uVar3 = buf->_used - len;
  if (buf->_used < len) {
    return -1;
  }
  sVar4 = off;
  if ((len != 0) && (sVar4 = uVar3, uVar3 < off)) {
    return -0x10;
  }
  __dest = (void *)((long)&buf[1]._vptr + off);
  pmVar1 = buf->_content_traits;
  if (pmVar1 != (mpt_type_traits *)0x0) {
    uVar3 = pmVar1->size;
    if ((uVar3 == 0) || (off % uVar3 != 0)) {
      return -1;
    }
    if (len % uVar3 != 0) {
      return -1;
    }
    p_Var2 = pmVar1->fini;
    if (len != 0 && p_Var2 != (_func_void_void_ptr *)0x0) {
      uVar5 = 0;
      do {
        (*p_Var2)((void *)(uVar5 + (long)__dest));
        uVar5 = uVar5 + uVar3;
      } while (uVar5 < len);
    }
  }
  if (sVar4 - off != 0) {
    memmove(__dest,(void *)(len + (long)__dest),sVar4 - off);
    off = sVar4;
  }
  buf->_used = off;
  return off;
}

Assistant:

ssize_t mpt_buffer_cut(MPT_STRUCT(buffer) *buf, size_t off, size_t len)
{
	const MPT_STRUCT(type_traits) *traits;
	uint8_t *pos;
	size_t keep;
	
	if (len > buf->_used) {
		return MPT_ERROR(BadArgument);
	}
	/* only keep data till offset */
	if (!len) {
		keep = off;
	}
	/* dat must be in range */
	else if ((keep = buf->_used - len) < off) {
		return MPT_ERROR(MissingData);
	}
	/* data start */
	pos = ((uint8_t *) (buf + 1)) + off;
	
	/* invalidate data to cut */
	if ((traits = buf->_content_traits)) {
		void (*fini)(void *);
		size_t size;
		if (!(size = traits->size)
		    || off % size
		    || len % size) {
			return MPT_ERROR(BadArgument);
		}
		if ((fini = traits->fini)) {
			size_t i;
			for (i = 0; i < len; i += size) {
				fini(pos + i);
			}
		}
	}
	/* move forward data after cut */
	keep -= off;
	if (keep) {
		memmove(pos, pos + len, keep);
		off += keep;
	}
	buf->_used = off;
	return off;
}